

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obs2gal.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  bool bVar4;
  double dVar5;
  CEDate date;
  CESkyCoord gal_coords;
  CESkyCoord obs_coords;
  CEObserver observer;
  CEExecOptions opts;
  string local_408 [2];
  double local_3c8 [2];
  double local_3b8 [2];
  string local_3a8;
  string local_378;
  undefined8 local_348;
  CESkyCoordType local_33c;
  string local_338;
  double local_318;
  CEObserver local_310 [32];
  double local_2f0;
  double local_2e8;
  double local_2e0;
  double local_2d8;
  CEExecOptions local_260;
  
  DefineOpts();
  bVar4 = CLOptions::ParseCommandLine(&local_260.super_CLOptions,argc,argv);
  if (!bVar4) {
    paVar1 = &local_408[0].field_2;
    local_408[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"longitude","");
    local_338._M_dataplus._M_p = (pointer)CLOptions::AsDouble(&local_260.super_CLOptions,local_408);
    paVar3 = &local_378.field_2;
    local_378._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"latitude","");
    local_3c8[0] = CLOptions::AsDouble(&local_260.super_CLOptions,&local_378);
    paVar2 = &local_3a8.field_2;
    local_3a8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"elevation","");
    local_3b8[0] = CLOptions::AsDouble(&local_260.super_CLOptions,&local_3a8);
    local_348 = (double)((ulong)local_348._4_4_ << 0x20);
    CEObserver::CEObserver
              (local_310,(double *)&local_338,local_3c8,local_3b8,(CEAngleType *)&local_348);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != paVar2) {
      operator_delete(local_3a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != paVar3) {
      operator_delete(local_378._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_408[0]._M_dataplus._M_p);
    }
    local_408[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"pressure","");
    local_2f0 = CLOptions::AsDouble(&local_260.super_CLOptions,local_408);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_408[0]._M_dataplus._M_p);
    }
    local_408[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"temperature","");
    local_2e8 = CLOptions::AsDouble(&local_260.super_CLOptions,local_408);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_408[0]._M_dataplus._M_p);
    }
    local_408[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"humidity","");
    local_2e0 = CLOptions::AsDouble(&local_260.super_CLOptions,local_408);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_408[0]._M_dataplus._M_p);
    }
    local_408[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"wavelength","");
    local_2d8 = CLOptions::AsDouble(&local_260.super_CLOptions,local_408);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_408[0]._M_dataplus._M_p);
    }
    local_378._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"juliandate","");
    dVar5 = CLOptions::AsDouble(&local_260.super_CLOptions,&local_378);
    CEDate::CEDate((CEDate *)local_408,dVar5,JD);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != paVar3) {
      operator_delete(local_378._M_dataplus._M_p);
    }
    local_3a8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"azimuth","");
    local_348 = CLOptions::AsDouble(&local_260.super_CLOptions,&local_3a8);
    CEAngle::Deg(local_3c8);
    local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"zenith","");
    local_318 = CLOptions::AsDouble(&local_260.super_CLOptions,&local_338);
    CEAngle::Deg(local_3b8);
    local_33c = OBSERVED;
    CESkyCoord::CESkyCoord
              ((CESkyCoord *)&local_378,(CEAngle *)local_3c8,(CEAngle *)local_3b8,&local_33c);
    CEAngle::~CEAngle((CEAngle *)local_3b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != &local_338.field_2) {
      operator_delete(local_338._M_dataplus._M_p);
    }
    CEAngle::~CEAngle((CEAngle *)local_3c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != paVar2) {
      operator_delete(local_3a8._M_dataplus._M_p);
    }
    CESkyCoord::ConvertToGalactic((CEDate *)&local_3a8,(CEObserver *)&local_378);
    PrintResults(&local_260,(CESkyCoord *)&local_3a8);
    CESkyCoord::~CESkyCoord((CESkyCoord *)&local_3a8);
    CESkyCoord::~CESkyCoord((CESkyCoord *)&local_378);
    CEDate::~CEDate((CEDate *)local_408);
    CEObserver::~CEObserver(local_310);
  }
  CEExecOptions::~CEExecOptions(&local_260);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
    
    // Parse the command line options
    CEExecOptions opts = DefineOpts() ;
    if (opts.ParseCommandLine(argc, argv)) return 0;
    
    // Define the observer
    CEObserver observer(opts.AsDouble("longitude"),
                        opts.AsDouble("latitude"),
                        opts.AsDouble("elevation"),
                        CEAngleType::DEGREES);
    observer.SetPressure_hPa(opts.AsDouble("pressure"));
    observer.SetTemperature_C(opts.AsDouble("temperature"));
    observer.SetRelativeHumidity(opts.AsDouble("humidity"));
    observer.SetWavelength_um(opts.AsDouble("wavelength"));

    // Define the date
    CEDate date(opts.AsDouble("juliandate"), CEDateType::JD);

    // Convert the coordinates
    CESkyCoord obs_coords(CEAngle::Deg(opts.AsDouble("azimuth")),
                          CEAngle::Deg(opts.AsDouble("zenith")),
                          CESkyCoordType::OBSERVED);
    CESkyCoord gal_coords = obs_coords.ConvertToGalactic(date, observer);
    
    // Print the results
    PrintResults(opts, gal_coords);
    
    return 0;
}